

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

statement_base * __thiscall
cs::method_case::translate
          (method_case *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  char *pcVar1;
  int iVar2;
  const_reference pptVar3;
  token_base **pptVar4;
  string *file;
  element_type *peVar5;
  reference code;
  statement_base *psVar6;
  iterator this_00;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  char *what;
  size_t line_num;
  tree_type<cs::token_base_*> *tree;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_fffffffffffffdc8;
  compiler_type *in_stack_fffffffffffffdd0;
  _Self *in_stack_fffffffffffffdd8;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_fffffffffffffde0;
  iterator *in_stack_fffffffffffffe10;
  iterator *this_01;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_fffffffffffffe20;
  string *what_00;
  allocator_type *in_stack_fffffffffffffe38;
  size_t line;
  exception *in_stack_fffffffffffffe40;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  *in_stack_fffffffffffffe48;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_fffffffffffffe50;
  token_base *in_stack_fffffffffffffe80;
  context_t *in_stack_fffffffffffffe88;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_fffffffffffffe90;
  var *in_stack_fffffffffffffe98;
  statement_case *in_stack_fffffffffffffea0;
  undefined1 local_a9 [33];
  string local_88 [48];
  string local_58 [32];
  char *local_38;
  size_t local_30;
  tree_node *local_28;
  tree_type<cs::token_base_*> *local_20;
  
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)in_stack_fffffffffffffde0);
  pptVar3 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                       in_stack_fffffffffffffdd0,(size_type)in_stack_fffffffffffffdc8);
  local_20 = token_expr::get_tree((token_expr *)*pptVar3);
  local_28 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffdc8);
  pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffe10);
  iVar2 = (*(*pptVar4)->_vptr_token_base[2])();
  if (iVar2 != 7) {
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             *)in_stack_fffffffffffffde0);
    pptVar3 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back
                        (in_stack_fffffffffffffde0);
    local_30 = token_base::get_line_num(*pptVar3);
    local_38 = "Case Tag must be a constant value.";
    file = (string *)__cxa_allocate_exception(0x90);
    line = local_30;
    peVar5 = std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x564e42);
    std::__cxx11::string::string(local_58,(string *)&peVar5->file_path);
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x564e65);
    code = std::
           deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffdd0,(size_type)in_stack_fffffffffffffdc8);
    std::__cxx11::string::string(local_88,(string *)code);
    pcVar1 = local_38;
    what_00 = (string *)local_a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_a9 + 1),pcVar1,(allocator *)what_00);
    exception::exception(in_stack_fffffffffffffe40,line,file,code,what_00);
    __cxa_throw(file,&exception::typeinfo,exception::~exception);
  }
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x564fcd);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x564fda);
  std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x564fe2);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::begin(in_stack_fffffffffffffdc8);
  std::operator+(in_stack_fffffffffffffdd8,(difference_type)in_stack_fffffffffffffdd0);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::end(in_stack_fffffffffffffdc8);
  this_01 = (iterator *)&stack0xfffffffffffffe4f;
  std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::allocator
            ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)0x565049
            );
  std::
  deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
  ::
  deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
             (_Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
              *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  compiler_type::translate
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x565081);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            *)in_stack_fffffffffffffe20);
  std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::~allocator
            ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)0x56509d
            );
  psVar6 = (statement_base *)statement_base::operator_new((size_t)in_stack_fffffffffffffdd0);
  this_00 = tree_type<cs::token_base_*>::root
                      ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffdc8);
  pptVar4 = tree_type<cs::token_base_*>::iterator::data(this_01);
  token_value::get_value((token_value *)*pptVar4);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)this_00.mData);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)this_00.mData);
  statement_case::statement_case
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
             in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
            (in_stack_fffffffffffffe20);
  return psVar6;
}

Assistant:

statement_base *method_case::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		if (tree.root().data()->get_type() != token_types::value) {
			std::size_t line_num = static_cast<token_endline *>(raw.front().back())->get_line_num();
			const char *what = "Case Tag must be a constant value.";
			throw exception(line_num, context->file_path, context->file_buff.at(line_num - 1), what);
		}
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
		return new statement_case(static_cast<token_value *>(tree.root().data())->get_value(), body, context,
		                          raw.front().back());
	}